

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::EnumValueDescriptorProto::~EnumValueDescriptorProto
          (EnumValueDescriptorProto *this)

{
  EnumValueDescriptorProto *this_local;
  
  ~EnumValueDescriptorProto(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

EnumValueDescriptorProto::~EnumValueDescriptorProto() = default;